

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_suite::random_access_iterator_index(void)

{
  reference piVar1;
  reference piVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  undefined4 local_64;
  vector<int,_std::allocator<int>_> local_60;
  basic_iterator<int> local_48;
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = (pointer)0x160000000b;
  local_38.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_48);
  local_38.member.data = (pointer)0x0;
  if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_38.member.data =
         local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_38.member.cap =
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_48.current = 0;
  local_48.parent = &local_38;
  local_38.member.size = local_38.member.cap;
  local_38.member.next = local_38.member.cap;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator[]
                     (&local_48,2);
  local_64 = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.begin()[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xe3,"void concept_suite::random_access_iterator_index()",piVar1,&local_64);
  local_48.current = local_38.member.cap * 2;
  if ((local_48.current & local_38.member.cap * 2 - 1) == 0) {
    local_48.current = local_48.current - 1 & local_38.member.next - local_38.member.size;
  }
  else {
    local_48.current = (local_38.member.next - local_38.member.size) % local_48.current;
  }
  local_48.parent = &local_38;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator[]
                     ((basic_iterator<const_int> *)&local_48,2);
  local_64 = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.cbegin()[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xe4,"void concept_suite::random_access_iterator_index()",piVar2,&local_64);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_index()
{
    // a[n]
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    BOOST_TEST_EQ(span.begin()[2], 33);
    BOOST_TEST_EQ(span.cbegin()[2], 33);
}